

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

String __thiscall testing::internal::StrStreamToString(internal *this,StrStream *ss)

{
  undefined1 *puVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  long lVar3;
  String SVar4;
  StrStream helper;
  char *local_1f8;
  char local_1e8 [16];
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringbuf::str();
  puVar1 = local_1d8;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (local_1d0 != 0) {
    lVar3 = 0;
    do {
      if (puVar1[lVar3] == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\\0",2);
      }
      else {
        std::ostream::put((char)local_1a8);
      }
      lVar3 = lVar3 + 1;
    } while (local_1d0 != lVar3);
  }
  std::__cxx11::stringbuf::str();
  String::String((String *)this,local_1f8);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  sVar2 = extraout_RDX;
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
    sVar2 = extraout_RDX_00;
  }
  SVar4.length_ = sVar2;
  SVar4.c_str_ = (char *)this;
  return SVar4;
}

Assistant:

String StrStreamToString(StrStream* ss) {
  const ::std::string& str = ss->str();
  const char* const start = str.c_str();
  const char* const end = start + str.length();

  // We need to use a helper StrStream to do this transformation
  // because String doesn't support push_back().
  StrStream helper;
  for (const char* ch = start; ch != end; ++ch) {
    if (*ch == '\0') {
      helper << "\\0";  // Replaces NUL with "\\0";
    } else {
      helper.put(*ch);
    }
  }

  return String(helper.str().c_str());
}